

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::EnumOptions::_InternalParse(EnumOptions *this,char *ptr,ParseContext *ctx)

{
  uint uVar1;
  bool bVar2;
  uint64 uVar3;
  UninterpretedOption *msg;
  char cVar4;
  uint uVar5;
  uint32 tag;
  char *local_50;
  uint local_44;
  InternalMetadataWithArena *local_40;
  ExtensionSet *local_38;
  
  local_40 = &this->_internal_metadata_;
  local_38 = &this->_extensions_;
  uVar5 = 0;
  local_50 = ptr;
  do {
    while( true ) {
      bVar2 = internal::ParseContext::Done(ctx,&local_50);
      if (bVar2) goto LAB_002c07c5;
      local_50 = internal::ReadTag(local_50,&local_44,0);
      if (local_50 == (char *)0x0) goto LAB_002c07bc;
      uVar1 = local_44 >> 3;
      cVar4 = (char)local_44;
      if (uVar1 != 999) break;
      if (cVar4 == ':') {
        local_50 = local_50 + -2;
        do {
          local_50 = local_50 + 2;
          msg = RepeatedPtrField<google::protobuf::UninterpretedOption>::Add
                          (&this->uninterpreted_option_);
          local_50 = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                               (ctx,msg,local_50);
          if (local_50 == (char *)0x0) goto LAB_002c07bc;
        } while ((local_50 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (bVar2 = internal::ExpectTag<7994u>(local_50), bVar2));
      }
      else {
LAB_002c0767:
        if (((ulong)local_44 == 0) || ((local_44 & 7) == 4)) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_44 - 1;
          goto LAB_002c07c5;
        }
        if (local_44 < 8000) {
          local_50 = internal::UnknownFieldParse(local_44,local_40,local_50,ctx);
        }
        else {
          local_50 = internal::ExtensionSet::ParseField
                               (local_38,(ulong)local_44,local_50,
                                (Message *)_EnumOptions_default_instance_,local_40,ctx);
        }
        if (local_50 == (char *)0x0) goto LAB_002c07bc;
      }
    }
    if (uVar1 == 3) {
      if (cVar4 == '\x18') {
        uVar5 = uVar5 | 2;
        uVar3 = internal::ReadVarint(&local_50);
        this->deprecated_ = uVar3 != 0;
        goto LAB_002c0705;
      }
      goto LAB_002c0767;
    }
    if ((uVar1 != 2) || (cVar4 != '\x10')) goto LAB_002c0767;
    uVar5 = uVar5 | 1;
    uVar3 = internal::ReadVarint(&local_50);
    this->allow_alias_ = uVar3 != 0;
LAB_002c0705:
  } while (local_50 != (char *)0x0);
LAB_002c07bc:
  local_50 = (char *)0x0;
LAB_002c07c5:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar5;
  return local_50;
}

Assistant:

const char* EnumOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional bool allow_alias = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_allow_alias(&has_bits);
          allow_alias_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool deprecated = 3 [default = false];
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}